

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

string * czh::utils::prettify_string(string *__return_storage_ptr__,string *buffer,int k)

{
  size_type sVar1;
  const_reference pvVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  char *local_138;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  const_iterator local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  char *local_f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  const_iterator local_e0;
  char *local_d8;
  char *local_d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  const_iterator local_b0;
  char *local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  char *local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  const_iterator local_80;
  char *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  const_iterator local_68;
  int local_4c;
  int local_48;
  int kk;
  int nb_digits;
  int end_pos;
  string ret;
  int k_local;
  string *buffer_local;
  
  ret.field_2._12_4_ = k;
  std::__cxx11::string::string((string *)&nb_digits);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (buffer);
  local_48 = (int)sVar1;
  local_4c = local_48 + ret.field_2._12_4_;
  kk = local_48;
  if ((local_4c < local_48) || (0x15 < local_4c)) {
    if ((local_4c < 1) || (0x15 < local_4c)) {
      if ((local_4c < -5) || (0 < local_4c)) {
        if (local_48 == 1) {
          std::operator+(&local_110,buffer,"e");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits
                     ,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          fill_exponent(local_4c + -1,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &nb_digits);
        }
        else {
          pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](buffer,0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits
                     ,*pvVar2);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits
                     ,".");
          local_120._M_current =
               (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&nb_digits);
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_118,&local_120);
          local_130._M_current =
               (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                 (buffer);
          local_128 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_130,1);
          local_140._M_current =
               (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                 (buffer);
          local_138 = (char *)__gnu_cxx::
                              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator+(&local_140,(long)local_48);
          std::__cxx11::string::
          insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)&nb_digits,local_118,local_128,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_138);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits
                     ,'e');
          fill_exponent(local_4c + -1,(string *)&nb_digits);
        }
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits,
                   "0.");
        local_e8._M_current =
             (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &nb_digits);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_e0,&local_e8);
        local_f0 = (char *)std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&nb_digits,local_e0,(long)-local_4c,'0');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits,
                   buffer);
      }
    }
    else {
      local_88._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &nb_digits);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_80,&local_88);
      local_90._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin(buffer);
      local_a0._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin(buffer);
      local_98 = (char *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(&local_a0,(long)local_4c);
      local_a8 = (char *)std::__cxx11::string::
                         insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                                   ((string *)&nb_digits,local_80,local_90,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_98);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits,'.'
                );
      local_b8._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &nb_digits);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_b0,&local_b8);
      local_c8._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   begin(buffer);
      local_c0 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_c8,(long)local_4c);
      local_d0 = (char *)std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                   (buffer);
      local_d8 = (char *)std::__cxx11::string::
                         insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                                   ((string *)&nb_digits,local_b0,local_c0,
                                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_d0);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits,
               buffer);
    local_70._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits
                    );
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_68,&local_70);
    local_78 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&nb_digits,local_68,(long)(local_4c + -1),'0');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits,".0")
    ;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nb_digits);
  std::__cxx11::string::~string((string *)&nb_digits);
  return __return_storage_ptr__;
}

Assistant:

std::string prettify_string(const std::string &buffer, int k)
  {
    std::string ret;
    int end_pos = static_cast<int>(buffer.size());
    int nb_digits = end_pos;
    int kk = nb_digits + k;
    if (nb_digits <= kk && kk <= 21)
    {
      ret = buffer;
      ret.insert(ret.end(), kk - 1, '0');
      ret += ".0";
    }
    else if (0 < kk && kk <= 21)
    {
      ret.insert(ret.end(), buffer.begin(), buffer.begin() + kk);
      ret += '.';
      ret.insert(ret.end(), buffer.begin() + kk, buffer.end());
    }
    else if (-6 < kk && kk <= 0)
    {
      ret = "0.";
      ret.insert(ret.end(), -kk, '0');
      ret += buffer;
    }
    else if (nb_digits == 1)
    {
      ret = buffer + "e";
      fill_exponent(kk - 1, ret);
    }
    else
    {
      ret = buffer[0];
      ret += ".";
      ret.insert(ret.end(), buffer.begin() + 1, buffer.begin() + nb_digits);
      ret += 'e';
      fill_exponent(kk - 1, ret);
    }
    return std::move(ret);
  }